

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

bool flatbuffers::anon_unknown_101::VerifyObject
               (Verifier *v,Schema *schema,Object *obj,Table *table,bool required)

{
  long lVar1;
  bool bVar2;
  ushort uVar3;
  voffset_t vVar4;
  long lVar5;
  Vector<signed_char,_unsigned_int> *vec;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec_00;
  Vector<flatbuffers::Offset<unsigned_char>,_unsigned_int> *vec_01;
  Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int> *vec_02;
  Field *pFVar6;
  Schema *pSVar7;
  long lVar8;
  Table *pTVar9;
  char *__function;
  Table utype;
  ushort uVar10;
  Object *pOVar11;
  size_t elem_size;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  Field *union_field;
  ulong uVar17;
  
  if (table == (Table *)0x0) {
    return !required;
  }
  bVar2 = VerifierTemplate<false>::VerifyTableStart(v,(uint8_t *)table);
  if (!bVar2) {
    return false;
  }
  uVar17 = (ulong)*(ushort *)(obj + (6 - (long)*(int *)obj));
  uVar13 = (ulong)*(uint *)(obj + uVar17);
  if (*(int *)(obj + uVar13 + uVar17) != 0) {
    uVar16 = 0;
    do {
      if (*(uint *)(obj + uVar13 + uVar17) <= uVar16) {
        __function = 
        "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Field>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Field>, SizeT = unsigned int]"
        ;
        goto LAB_0014b27d;
      }
      uVar15 = (ulong)(uint)((int)uVar16 * 4);
      lVar1 = (ulong)*(uint *)(obj + uVar15 + uVar13 + uVar17 + 4) + uVar15 + uVar13 + uVar17;
      union_field = (Field *)(obj + lVar1 + 4);
      lVar5 = -(long)*(int *)union_field;
      uVar3 = *(ushort *)(union_field + -(long)*(int *)union_field);
      if ((uVar3 < 7) || (uVar17 = (ulong)*(ushort *)(obj + lVar5 + lVar1 + 10), uVar17 == 0)) {
        pFVar6 = (Field *)0x0;
      }
      else {
        pFVar6 = union_field + *(uint *)(union_field + uVar17) + uVar17;
      }
      if ((*(ushort *)(pFVar6 + -(long)*(int *)pFVar6) < 5) ||
         ((ulong)*(ushort *)(pFVar6 + (4 - (long)*(int *)pFVar6)) == 0)) {
switchD_0014a66a_caseD_0:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                      ,0xb2,
                      "bool flatbuffers::(anonymous namespace)::VerifyObject(flatbuffers::Verifier &, const reflection::Schema &, const reflection::Object &, const flatbuffers::Table *, bool)"
                     );
      }
      switch(pFVar6[*(ushort *)(pFVar6 + (4 - (long)*(int *)pFVar6))].super_Table) {
      case (Table)0x0:
        goto switchD_0014a66a_caseD_0;
      case (Table)0x1:
      case (Table)0x2:
      case (Table)0x3:
      case (Table)0x4:
        if ((uVar3 < 0xb) || ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0xe) == 0)) {
          uVar3 = 0;
        }
        else {
          uVar3 = *(ushort *)(union_field + *(ushort *)(obj + lVar5 + lVar1 + 0xe));
        }
        if ((uVar3 < *(ushort *)(table + -(long)*(int *)table)) &&
           ((ulong)*(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table)) != 0)) {
          if (v->size_ < 2) {
            return false;
          }
          if ((Table *)(v->size_ - 1) <
              table + ((ulong)*(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table)) -
                      (long)v->buf_)) {
            return false;
          }
        }
        goto LAB_0014ad4e;
      case (Table)0x5:
      case (Table)0x6:
        if ((uVar3 < 0xb) || ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0xe) == 0)) {
          vVar4 = 0;
        }
        else {
          vVar4 = *(voffset_t *)(union_field + *(ushort *)(obj + lVar5 + lVar1 + 0xe));
        }
        bVar2 = Table::VerifyField<short>(table,v,vVar4,2);
        break;
      case (Table)0x7:
      case (Table)0x8:
        if ((uVar3 < 0xb) || ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0xe) == 0)) {
          vVar4 = 0;
        }
        else {
          vVar4 = *(voffset_t *)(union_field + *(ushort *)(obj + lVar5 + lVar1 + 0xe));
        }
        bVar2 = Table::VerifyField<int>(table,v,vVar4,4);
        break;
      case (Table)0x9:
      case (Table)0xa:
        if ((uVar3 < 0xb) || ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0xe) == 0)) {
          vVar4 = 0;
        }
        else {
          vVar4 = *(voffset_t *)(union_field + *(ushort *)(obj + lVar5 + lVar1 + 0xe));
        }
        bVar2 = Table::VerifyField<long>(table,v,vVar4,8);
        break;
      case (Table)0xb:
        if ((uVar3 < 0xb) || ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0xe) == 0)) {
          vVar4 = 0;
        }
        else {
          vVar4 = *(voffset_t *)(union_field + *(ushort *)(obj + lVar5 + lVar1 + 0xe));
        }
        bVar2 = Table::VerifyField<float>(table,v,vVar4,4);
        break;
      case (Table)0xc:
        if ((uVar3 < 0xb) || ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0xe) == 0)) {
          vVar4 = 0;
        }
        else {
          vVar4 = *(voffset_t *)(union_field + *(ushort *)(obj + lVar5 + lVar1 + 0xe));
        }
        bVar2 = Table::VerifyField<double>(table,v,vVar4,8);
        break;
      case (Table)0xd:
        if ((uVar3 < 0xb) || ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0xe) == 0)) {
          vVar4 = 0;
        }
        else {
          vVar4 = *(voffset_t *)(union_field + *(ushort *)(obj + lVar5 + lVar1 + 0xe));
        }
        bVar2 = Table::VerifyField<unsigned_int>(table,v,vVar4,4);
        if (!bVar2) {
          return false;
        }
        lVar5 = -(long)*(int *)union_field;
        if ((*(ushort *)(union_field + -(long)*(int *)union_field) < 7) ||
           (uVar17 = (ulong)*(ushort *)(obj + lVar5 + lVar1 + 10), uVar17 == 0)) {
          pFVar6 = (Field *)0x0;
        }
        else {
          pFVar6 = union_field + *(uint *)(union_field + uVar17) + uVar17;
        }
        if (((*(ushort *)(pFVar6 + -(long)*(int *)pFVar6) < 5) ||
            ((ulong)*(ushort *)(pFVar6 + (4 - (long)*(int *)pFVar6)) == 0)) ||
           (pFVar6[*(ushort *)(pFVar6 + (4 - (long)*(int *)pFVar6))].super_Table != (Table)0xd)) {
          __assert_fail("field.type()->base_type() == reflection::String",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                        ,0x8b,
                        "const String *flatbuffers::GetFieldS(const Table &, const reflection::Field &)"
                       );
        }
        if ((*(ushort *)(union_field + -(long)*(int *)union_field) < 0xb) ||
           ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0xe) == 0)) {
          uVar3 = 0;
        }
        else {
          uVar3 = *(ushort *)(union_field + *(ushort *)(obj + lVar5 + lVar1 + 0xe));
        }
        if ((uVar3 < *(ushort *)(table + -(long)*(int *)table)) &&
           (uVar17 = (ulong)*(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table)), uVar17 != 0))
        {
          pTVar9 = table + *(uint *)(table + uVar17) + uVar17;
        }
        else {
          pTVar9 = (Table *)0x0;
        }
        bVar2 = VerifierTemplate<false>::VerifyString(v,(String *)pTVar9);
        break;
      case (Table)0xe:
        uVar17 = (ulong)*(ushort *)(obj + lVar5 + lVar1 + 10);
        lVar14 = *(uint *)(union_field + uVar17) + uVar17;
        if (((*(ushort *)
               (union_field +
               (lVar14 - *(int *)(union_field + *(uint *)(union_field + uVar17) + uVar17))) < 5) ||
            ((ulong)*(ushort *)
                     (union_field +
                     ((lVar14 + 4) -
                     (long)*(int *)(union_field + *(uint *)(union_field + uVar17) + uVar17))) == 0))
           || (union_field
               [(ulong)*(ushort *)
                        (union_field +
                        ((lVar14 + 4) -
                        (long)*(int *)(union_field + *(uint *)(union_field + uVar17) + uVar17))) +
                lVar14].super_Table != (Table)0xe)) {
          __assert_fail("vec_field.type()->base_type() == reflection::Vector",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                        ,0x5e,
                        "bool flatbuffers::(anonymous namespace)::VerifyVector(flatbuffers::Verifier &, const reflection::Schema &, const flatbuffers::Table &, const reflection::Field &)"
                       );
        }
        if ((uVar3 < 0xb) || ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0xe) == 0)) {
          vVar4 = 0;
        }
        else {
          vVar4 = *(voffset_t *)(union_field + *(ushort *)(obj + lVar5 + lVar1 + 0xe));
        }
        bVar2 = Table::VerifyField<unsigned_int>(table,v,vVar4,4);
        if (!bVar2) {
          return false;
        }
        uVar17 = (ulong)*(ushort *)(union_field + -(long)*(int *)union_field + 6);
        lVar5 = *(uint *)(union_field + uVar17) + uVar17;
        if (*(ushort *)
             (union_field +
             (lVar5 - *(int *)(union_field + *(uint *)(union_field + uVar17) + uVar17))) < 7) {
switchD_0014ab33_caseD_e:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                        ,0xa5,
                        "bool flatbuffers::(anonymous namespace)::VerifyVector(flatbuffers::Verifier &, const reflection::Schema &, const flatbuffers::Table &, const reflection::Field &)"
                       );
        }
        lVar14 = -(long)*(int *)(union_field + *(uint *)(union_field + uVar17) + uVar17);
        if ((ulong)*(ushort *)(union_field + lVar14 + lVar5 + 6) == 0)
        goto switchD_0014ab33_caseD_e;
        switch(union_field[(ulong)*(ushort *)(union_field + lVar14 + lVar5 + 6) + lVar5].super_Table
              ) {
        case (Table)0x1:
          vec = (Vector<signed_char,_unsigned_int> *)GetFieldV<unsigned_char>(table,union_field);
          break;
        case (Table)0x2:
        case (Table)0x3:
        case (Table)0x4:
          vec = GetFieldV<signed_char>(table,union_field);
          break;
        case (Table)0x5:
        case (Table)0x6:
          vec = (Vector<signed_char,_unsigned_int> *)GetFieldV<short>(table,union_field);
          if (vec == (Vector<signed_char,_unsigned_int> *)0x0) goto LAB_0014ad4e;
          elem_size = 2;
          goto LAB_0014af45;
        case (Table)0x7:
        case (Table)0x8:
          vec = (Vector<signed_char,_unsigned_int> *)GetFieldV<int>(table,union_field);
          goto LAB_0014ae1e;
        case (Table)0x9:
        case (Table)0xa:
          vec = (Vector<signed_char,_unsigned_int> *)GetFieldV<long>(table,union_field);
          goto LAB_0014adbf;
        case (Table)0xb:
          vec = (Vector<signed_char,_unsigned_int> *)GetFieldV<float>(table,union_field);
LAB_0014ae1e:
          if (vec != (Vector<signed_char,_unsigned_int> *)0x0) {
            elem_size = 4;
            goto LAB_0014af45;
          }
          goto LAB_0014ad4e;
        case (Table)0xc:
          vec = (Vector<signed_char,_unsigned_int> *)GetFieldV<double>(table,union_field);
LAB_0014adbf:
          if (vec != (Vector<signed_char,_unsigned_int> *)0x0) {
            elem_size = 8;
            goto LAB_0014af45;
          }
          goto LAB_0014ad4e;
        case (Table)0xd:
          vec_00 = GetFieldV<flatbuffers::Offset<flatbuffers::String>>(table,union_field);
          if ((vec_00 != (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0) &&
             (bVar2 = VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                (v,(uint8_t *)vec_00,4,(size_t *)0x0), !bVar2)) {
            return false;
          }
          bVar2 = VerifierTemplate<false>::VerifyVectorOfStrings(v,vec_00);
          goto LAB_0014ad46;
        default:
          goto switchD_0014ab33_caseD_e;
        case (Table)0xf:
          if ((*(ushort *)(schema + -(long)*(int *)schema) < 5) ||
             (uVar13 = (ulong)*(ushort *)(schema + (4 - (long)*(int *)schema)), uVar13 == 0)) {
            pSVar7 = (Schema *)0x0;
          }
          else {
            pSVar7 = schema + *(uint *)(schema + uVar13) + uVar13;
          }
          if (((*(ushort *)
                 (union_field +
                 (lVar5 - *(int *)(union_field + *(uint *)(union_field + uVar17) + uVar17))) < 9) ||
              ((ulong)*(ushort *)(union_field + lVar14 + lVar5 + 8) == 0)) ||
             (*(uint *)pSVar7 <=
              *(uint *)(union_field + (ulong)*(ushort *)(union_field + lVar14 + lVar5 + 8) + lVar5))
             ) goto LAB_0014b2a6;
          uVar17 = (ulong)(*(uint *)(union_field +
                                    (ulong)*(ushort *)(union_field + lVar14 + lVar5 + 8) + lVar5) <<
                          2);
          lVar5 = *(uint *)(pSVar7 + uVar17 + 4) + uVar17;
          pOVar11 = (Object *)(pSVar7 + lVar5 + 4);
          if (((*(ushort *)(pOVar11 + -(long)*(int *)pOVar11) < 9) ||
              ((ulong)*(ushort *)(pSVar7 + ((lVar5 + 0xc) - (long)*(int *)pOVar11)) == 0)) ||
             (pOVar11[*(ushort *)(pSVar7 + ((lVar5 + 0xc) - (long)*(int *)pOVar11))].super_Table ==
              (Table)0x0)) {
            vec_02 = GetFieldV<flatbuffers::Offset<flatbuffers::Table>>(table,union_field);
            if (vec_02 != (Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int> *)0x0) {
              bVar2 = VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                (v,(uint8_t *)vec_02,4,(size_t *)0x0);
              if (!bVar2) {
                return false;
              }
              if (*(int *)vec_02 != 0) {
                uVar12 = 0;
                uVar17 = 0;
                do {
                  bVar2 = VerifyObject(v,schema,pOVar11,
                                       (Table *)(vec_02 + (ulong)*(uint *)(vec_02 + (ulong)uVar12 +
                                                                                    4) +
                                                          (ulong)uVar12 + 4),true);
                  if (!bVar2) {
                    return false;
                  }
                  uVar17 = uVar17 + 1;
                  uVar12 = uVar12 + 4;
                } while (uVar17 < *(uint *)vec_02);
              }
            }
            goto LAB_0014ad4e;
          }
          uVar3 = *(ushort *)(union_field + -(long)*(int *)union_field);
          if (uVar3 < 0xb) {
            vVar4 = 0;
LAB_0014b207:
            bVar2 = false;
          }
          else {
            lVar5 = -(long)*(int *)union_field;
            if ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0xe) == 0) {
              vVar4 = 0;
            }
            else {
              vVar4 = *(voffset_t *)(union_field + *(ushort *)(obj + lVar5 + lVar1 + 0xe));
            }
            if ((uVar3 < 0x13) || ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0x16) == 0))
            goto LAB_0014b207;
            bVar2 = union_field[*(ushort *)(obj + lVar5 + lVar1 + 0x16)].super_Table != (Table)0x0;
          }
          bVar2 = VerifyVectorOfStructs(v,table,vVar4,pOVar11,bVar2);
          goto LAB_0014ad46;
        case (Table)0x10:
          vec_01 = GetFieldV<flatbuffers::Offset<unsigned_char>>(table,union_field);
          if (vec_01 != (Vector<flatbuffers::Offset<unsigned_char>,_unsigned_int> *)0x0) {
            bVar2 = VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                              (v,(uint8_t *)vec_01,4,(size_t *)0x0);
            if (!bVar2) {
              return false;
            }
            uVar3 = 0xfffe;
            if ((10 < *(ushort *)(union_field + -(long)*(int *)union_field)) &&
               ((ulong)*(ushort *)(obj + ((lVar1 + 0xe) - (long)*(int *)union_field)) != 0)) {
              uVar3 = *(short *)(union_field +
                                *(ushort *)(obj + ((lVar1 + 0xe) - (long)*(int *)union_field))) - 2;
            }
            if ((uVar3 < *(ushort *)(table + -(long)*(int *)table)) &&
               (uVar17 = (ulong)*(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table)),
               uVar17 != 0)) {
              pTVar9 = table + *(uint *)(table + uVar17) + uVar17;
              bVar2 = VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                (v,(uint8_t *)pTVar9,1,(size_t *)0x0);
              if (!bVar2) {
                return false;
              }
            }
            else {
              pTVar9 = (Table *)0x0;
            }
            if (*(int *)vec_01 != 0) {
              uVar12 = 0;
              uVar17 = 0;
              do {
                if (*(uint *)pTVar9 <= uVar17) {
                  __function = 
                  "return_type flatbuffers::Vector<unsigned char>::Get(SizeT) const [T = unsigned char, SizeT = unsigned int]"
                  ;
                  goto LAB_0014b27d;
                }
                bVar2 = VerifyUnion(v,schema,(uint8_t)pTVar9[uVar17 + 4],
                                    (uint8_t *)
                                    (vec_01 + (ulong)*(uint *)(vec_01 + (ulong)uVar12 + 4) +
                                              (ulong)uVar12 + 4),union_field);
                if (!bVar2) {
                  return false;
                }
                uVar17 = uVar17 + 1;
                uVar12 = uVar12 + 4;
              } while (uVar17 < *(uint *)vec_01);
            }
          }
          goto LAB_0014ad4e;
        }
        if (vec != (Vector<signed_char,_unsigned_int> *)0x0) {
          elem_size = 1;
LAB_0014af45:
          bVar2 = VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                            (v,(uint8_t *)vec,elem_size,(size_t *)0x0);
          if (!bVar2) {
            return false;
          }
        }
        goto LAB_0014ad4e;
      case (Table)0xf:
        if ((*(ushort *)(schema + -(long)*(int *)schema) < 5) ||
           (uVar17 = (ulong)*(ushort *)(schema + (4 - (long)*(int *)schema)), uVar17 == 0)) {
          pSVar7 = (Schema *)0x0;
        }
        else {
          pSVar7 = schema + *(uint *)(schema + uVar17) + uVar17;
        }
        if ((uVar3 < 7) || (uVar17 = (ulong)*(ushort *)(obj + lVar5 + lVar1 + 10), uVar17 == 0)) {
          pFVar6 = (Field *)0x0;
        }
        else {
          pFVar6 = union_field + *(uint *)(union_field + uVar17) + uVar17;
        }
        if (((*(ushort *)(pFVar6 + -(long)*(int *)pFVar6) < 9) ||
            ((ulong)*(ushort *)(pFVar6 + (8 - (long)*(int *)pFVar6)) == 0)) ||
           (*(uint *)pSVar7 <= *(uint *)(pFVar6 + *(ushort *)(pFVar6 + (8 - (long)*(int *)pFVar6))))
           ) {
LAB_0014b2a6:
          __function = 
          "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
          ;
LAB_0014b27d:
          __assert_fail("i < size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                        ,0xc1,__function);
        }
        uVar17 = (ulong)(*(uint *)(pFVar6 + *(ushort *)(pFVar6 + (8 - (long)*(int *)pFVar6))) << 2);
        lVar14 = *(uint *)(pSVar7 + uVar17 + 4) + uVar17;
        pOVar11 = (Object *)(pSVar7 + lVar14 + 4);
        uVar10 = *(ushort *)(pOVar11 + -(long)*(int *)pOVar11);
        if (8 < uVar10) {
          lVar8 = -(long)*(int *)pOVar11;
          if (((ulong)*(ushort *)(pSVar7 + lVar8 + lVar14 + 0xc) != 0) &&
             (pOVar11[*(ushort *)(pSVar7 + lVar8 + lVar14 + 0xc)].super_Table != (Table)0x0)) {
            if (uVar3 < 0xb) {
              uVar17 = 0;
LAB_0014b0a5:
              bVar2 = false;
            }
            else {
              if ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0xe) == 0) {
                uVar17 = 0;
              }
              else {
                uVar17 = (ulong)*(ushort *)(union_field + *(ushort *)(obj + lVar5 + lVar1 + 0xe));
              }
              if ((uVar3 < 0x13) || ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0x16) == 0))
              goto LAB_0014b0a5;
              bVar2 = union_field[*(ushort *)(obj + lVar5 + lVar1 + 0x16)].super_Table != (Table)0x0
              ;
            }
            if ((*(ushort *)(table + -(long)*(int *)table) <= (ushort)uVar17) ||
               ((ulong)*(ushort *)(table + (uVar17 - (long)*(int *)table)) == 0)) {
              if (bVar2) {
                return false;
              }
              goto LAB_0014ad4e;
            }
            if (uVar10 < 0xd) {
              uVar15 = 0xffffffffffffffff;
              uVar13 = 0;
              if (10 < uVar10) goto LAB_0014b1a0;
            }
            else {
              if ((ulong)*(ushort *)(pSVar7 + lVar8 + lVar14 + 0x10) == 0) {
                uVar13 = 0;
              }
              else {
                uVar13 = (ulong)*(int *)(pOVar11 + *(ushort *)(pSVar7 + lVar8 + lVar14 + 0x10));
              }
LAB_0014b1a0:
              if ((ulong)*(ushort *)(pSVar7 + lVar8 + lVar14 + 0xe) == 0) {
                uVar15 = 0xffffffffffffffff;
              }
              else {
                uVar15 = (long)*(int *)(pOVar11 + *(ushort *)(pSVar7 + lVar8 + lVar14 + 0xe)) - 1;
              }
            }
            if ((((ulong)(table + ((ulong)*(ushort *)(table + (uVar17 - (long)*(int *)table)) -
                                  (long)v->buf_)) & uVar15) != 0) &&
               (((v->opts_).check_alignment & 1U) != 0)) {
              return false;
            }
            if (v->size_ <= uVar13) {
              return false;
            }
            if ((Table *)(v->size_ - uVar13) <
                table + ((ulong)*(ushort *)(table + (uVar17 - (long)*(int *)table)) - (long)v->buf_)
               ) {
              return false;
            }
            goto LAB_0014ad4e;
          }
        }
        if ((uVar3 < 7) || (uVar17 = (ulong)*(ushort *)(obj + lVar5 + lVar1 + 10), uVar17 == 0)) {
          pFVar6 = (Field *)0x0;
        }
        else {
          pFVar6 = union_field + *(uint *)(union_field + uVar17) + uVar17;
        }
        if (((*(ushort *)(pFVar6 + -(long)*(int *)pFVar6) < 5) ||
            ((ulong)*(ushort *)(pFVar6 + (4 - (long)*(int *)pFVar6)) == 0)) ||
           (pFVar6[*(ushort *)(pFVar6 + (4 - (long)*(int *)pFVar6))].super_Table != (Table)0xf)) {
          if ((uVar3 < 7) || (uVar17 = (ulong)*(ushort *)(obj + lVar5 + lVar1 + 10), uVar17 == 0)) {
            pFVar6 = (Field *)0x0;
          }
          else {
            pFVar6 = union_field + *(uint *)(union_field + uVar17) + uVar17;
          }
          if (((*(ushort *)(pFVar6 + -(long)*(int *)pFVar6) < 5) ||
              ((ulong)*(ushort *)(pFVar6 + (4 - (long)*(int *)pFVar6)) == 0)) ||
             (pFVar6[*(ushort *)(pFVar6 + (4 - (long)*(int *)pFVar6))].super_Table != (Table)0x10))
          {
LAB_0014b287:
            __assert_fail("field.type()->base_type() == reflection::Obj || field.type()->base_type() == reflection::Union"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                          ,0xa2,
                          "Table *flatbuffers::GetFieldT(const Table &, const reflection::Field &)")
            ;
          }
        }
        if ((uVar3 < 0xb) || ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0xe) == 0)) {
          uVar10 = 0;
        }
        else {
          uVar10 = *(ushort *)(union_field + *(ushort *)(obj + lVar5 + lVar1 + 0xe));
        }
        if ((uVar10 < *(ushort *)(table + -(long)*(int *)table)) &&
           (uVar17 = (ulong)*(ushort *)(table + ((ulong)uVar10 - (long)*(int *)table)), uVar17 != 0)
           ) {
          pTVar9 = table + *(uint *)(table + uVar17) + uVar17;
        }
        else {
          pTVar9 = (Table *)0x0;
        }
        if ((uVar3 < 0x13) || ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0x16) == 0)) {
          bVar2 = false;
        }
        else {
          bVar2 = union_field[*(ushort *)(obj + lVar5 + lVar1 + 0x16)].super_Table != (Table)0x0;
        }
        bVar2 = VerifyObject(v,schema,pOVar11,pTVar9,bVar2);
        break;
      case (Table)0x10:
        uVar10 = 0xfffe;
        if ((10 < uVar3) && ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0xe) != 0)) {
          uVar10 = *(short *)(union_field + *(ushort *)(obj + lVar5 + lVar1 + 0xe)) - 2;
        }
        lVar14 = (long)*(int *)table;
        if ((uVar10 < *(ushort *)(table + -lVar14)) &&
           ((ulong)*(ushort *)(table + ((ulong)uVar10 - lVar14)) != 0)) {
          utype = table[*(ushort *)(table + ((ulong)uVar10 - lVar14))];
        }
        else {
          utype = (Table)0x0;
        }
        if ((uVar3 < 7) || (uVar17 = (ulong)*(ushort *)(obj + lVar5 + lVar1 + 10), uVar17 == 0)) {
          pFVar6 = (Field *)0x0;
        }
        else {
          pFVar6 = union_field + *(uint *)(union_field + uVar17) + uVar17;
        }
        if (((*(ushort *)(pFVar6 + -(long)*(int *)pFVar6) < 5) ||
            ((ulong)*(ushort *)(pFVar6 + (4 - (long)*(int *)pFVar6)) == 0)) ||
           (pFVar6[*(ushort *)(pFVar6 + (4 - (long)*(int *)pFVar6))].super_Table != (Table)0xf)) {
          if ((uVar3 < 7) || (uVar17 = (ulong)*(ushort *)(obj + lVar5 + lVar1 + 10), uVar17 == 0)) {
            pFVar6 = (Field *)0x0;
          }
          else {
            pFVar6 = union_field + *(uint *)(union_field + uVar17) + uVar17;
          }
          if (((*(ushort *)(pFVar6 + -(long)*(int *)pFVar6) < 5) ||
              ((ulong)*(ushort *)(pFVar6 + (4 - (long)*(int *)pFVar6)) == 0)) ||
             (pFVar6[*(ushort *)(pFVar6 + (4 - (long)*(int *)pFVar6))].super_Table != (Table)0x10))
          goto LAB_0014b287;
        }
        if ((uVar3 < 0xb) || ((ulong)*(ushort *)(obj + lVar5 + lVar1 + 0xe) == 0)) {
          uVar3 = 0;
        }
        else {
          uVar3 = *(ushort *)(union_field + *(ushort *)(obj + lVar5 + lVar1 + 0xe));
        }
        if ((uVar3 < *(ushort *)(table + -lVar14)) &&
           (uVar17 = (ulong)*(ushort *)(table + ((ulong)uVar3 - lVar14)), uVar17 != 0)) {
          pTVar9 = table + *(uint *)(table + uVar17) + uVar17;
        }
        else {
          pTVar9 = (Table *)0x0;
        }
        bVar2 = VerifyUnion(v,schema,(uint8_t)utype,(uint8_t *)pTVar9,union_field);
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                      ,0xfb,
                      "bool flatbuffers::(anonymous namespace)::VerifyObject(flatbuffers::Verifier &, const reflection::Schema &, const reflection::Object &, const flatbuffers::Table *, bool)"
                     );
      }
LAB_0014ad46:
      if (bVar2 == false) {
        return false;
      }
LAB_0014ad4e:
      uVar16 = uVar16 + 1;
      uVar17 = (ulong)*(ushort *)(obj + (6 - (long)*(int *)obj));
      uVar13 = (ulong)*(uint *)(obj + uVar17);
    } while (uVar16 < *(uint *)(obj + uVar13 + uVar17));
  }
  v->depth_ = v->depth_ - 1;
  return true;
}

Assistant:

static bool VerifyObject(flatbuffers::Verifier &v,
                         const reflection::Schema &schema,
                         const reflection::Object &obj,
                         const flatbuffers::Table *table, bool required) {
  if (!table) return !required;
  if (!table->VerifyTableStart(v)) return false;
  for (uoffset_t i = 0; i < obj.fields()->size(); i++) {
    auto field_def = obj.fields()->Get(i);
    switch (field_def->type()->base_type()) {
      case reflection::None: FLATBUFFERS_ASSERT(false); break;
      case reflection::UType:
        if (!table->VerifyField<uint8_t>(v, field_def->offset(),
                                         sizeof(uint8_t)))
          return false;
        break;
      case reflection::Bool:
      case reflection::Byte:
      case reflection::UByte:
        if (!table->VerifyField<int8_t>(v, field_def->offset(), sizeof(int8_t)))
          return false;
        break;
      case reflection::Short:
      case reflection::UShort:
        if (!table->VerifyField<int16_t>(v, field_def->offset(),
                                         sizeof(int16_t)))
          return false;
        break;
      case reflection::Int:
      case reflection::UInt:
        if (!table->VerifyField<int32_t>(v, field_def->offset(),
                                         sizeof(int32_t)))
          return false;
        break;
      case reflection::Long:
      case reflection::ULong:
        if (!table->VerifyField<int64_t>(v, field_def->offset(),
                                         sizeof(int64_t)))
          return false;
        break;
      case reflection::Float:
        if (!table->VerifyField<float>(v, field_def->offset(), sizeof(float)))
          return false;
        break;
      case reflection::Double:
        if (!table->VerifyField<double>(v, field_def->offset(), sizeof(double)))
          return false;
        break;
      case reflection::String:
        if (!table->VerifyField<uoffset_t>(v, field_def->offset(),
                                           sizeof(uoffset_t)) ||
            !v.VerifyString(flatbuffers::GetFieldS(*table, *field_def))) {
          return false;
        }
        break;
      case reflection::Vector:
        if (!VerifyVector(v, schema, *table, *field_def)) return false;
        break;
      case reflection::Obj: {
        auto child_obj = schema.objects()->Get(field_def->type()->index());
        if (child_obj->is_struct()) {
          if (!VerifyStruct(v, *table, field_def->offset(), *child_obj,
                            field_def->required())) {
            return false;
          }
        } else {
          if (!VerifyObject(v, schema, *child_obj,
                            flatbuffers::GetFieldT(*table, *field_def),
                            field_def->required())) {
            return false;
          }
        }
        break;
      }
      case reflection::Union: {
        //  get union type from the prev field
        voffset_t utype_offset = field_def->offset() - sizeof(voffset_t);
        auto utype = table->GetField<uint8_t>(utype_offset, 0);
        auto uval = reinterpret_cast<const uint8_t *>(
            flatbuffers::GetFieldT(*table, *field_def));
        if (!VerifyUnion(v, schema, utype, uval, *field_def)) { return false; }
        break;
      }
      default: FLATBUFFERS_ASSERT(false); break;
    }
  }

  if (!v.EndTable()) return false;

  return true;
}